

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# perfetto.h
# Opt level: O3

void __thiscall
protozero::HeapBuffered<perfetto::protos::pbzero::InternedData>::Reset
          (HeapBuffered<perfetto::protos::pbzero::InternedData> *this)

{
  uint64_t *puVar1;
  MessageArena *this_00;
  
  ScatteredHeapBuffer::Reset(&this->shb_);
  puVar1 = &(this->writer_).written_previously_;
  *puVar1 = (uint64_t)
            ((this->writer_).write_ptr_ + (*puVar1 - (long)(this->writer_).cur_range_.begin));
  this_00 = &(this->msg_).root_arena_;
  (this->writer_).cur_range_.begin = (uint8_t *)0x0;
  (this->writer_).cur_range_.end = (uint8_t *)0x0;
  (this->writer_).write_ptr_ = (uint8_t *)0x0;
  std::__cxx11::
  list<protozero::MessageArena::Block,_std::allocator<protozero::MessageArena::Block>_>::resize
            ((list<protozero::MessageArena::Block,_std::allocator<protozero::MessageArena::Block>_>
              *)this_00,1);
  *(undefined4 *)
   &(*(_List_node_base **)
      ((long)&(this->msg_).root_arena_.blocks_.
              super__List_base<protozero::MessageArena::Block,_std::allocator<protozero::MessageArena::Block>_>
              ._M_impl._M_node.super__List_node_base + 8))[0x31]._M_next = 0;
  (this->msg_).super_InternedData.super_Message.stream_writer_ = &this->writer_;
  (this->msg_).super_InternedData.super_Message.arena_ = this_00;
  (this->msg_).super_InternedData.super_Message.nested_message_ = (Message *)0x0;
  (this->msg_).super_InternedData.super_Message.size_field_ = (uint8_t *)0x0;
  *(undefined8 *)((long)&(this->msg_).super_InternedData.super_Message.size_field_ + 1) = 0;
  *(undefined8 *)((long)&(this->msg_).super_InternedData.super_Message.size_ + 1) = 0;
  return;
}

Assistant:

void Reset() {
    shb_.Reset();
    writer_.Reset(protozero::ContiguousMemoryRange{});
    msg_.Reset(&writer_);
    PERFETTO_DCHECK(empty());
  }